

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

void Lf_ManCountMapRefs(Lf_Man_t *p)

{
  Vec_Int_t *p_00;
  Tim_Man_t *pTVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Jf_Par_t *pJVar6;
  Gia_Man_t *pGVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  float fVar12;
  
  uVar10 = 0;
  for (iVar11 = 0; pGVar7 = p->pGia, iVar11 < pGVar7->vCos->nSize; iVar11 = iVar11 + 1) {
    pGVar5 = Gia_ManCo(pGVar7,iVar11);
    uVar2 = Lf_ObjCoArrival2_rec(p,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff));
    if ((int)uVar10 <= (int)uVar2) {
      uVar10 = uVar2;
    }
  }
  pJVar6 = p->pPars;
  uVar9 = pJVar6->DelayTarget;
  uVar2 = uVar10;
  if (pJVar6->DelayTarget == 0xffffffff) {
    if (pJVar6->nRelaxRatio == 0) goto LAB_00594694;
    uVar9 = (uint)((((double)pJVar6->nRelaxRatio + 100.0) * (double)(int)uVar10) / 100.0);
    pJVar6->DelayTarget = uVar9;
    if (uVar9 == 0xffffffff) goto LAB_00594694;
  }
  uVar2 = uVar9;
  uVar8 = (ulong)uVar2;
  if (((double)(int)uVar2 + 0.01 <= (double)(int)uVar10) &&
     (uVar2 = uVar10, pJVar6->nRelaxRatio == 0)) {
    Abc_Print(0,"Relaxing user-specified delay target from %d to %d.\n",uVar8,(ulong)uVar10);
    pGVar7 = p->pGia;
    pJVar6 = p->pPars;
  }
LAB_00594694:
  pJVar6->Delay = (long)(int)uVar2;
  p->Switches = 0.0;
  pJVar6->Mux7 = 0;
  p_00 = &p->vRequired;
  pJVar6->Area = 0;
  pJVar6->Edge = 0;
  Vec_IntFill(p_00,pGVar7->nObjs,1000000000);
  if (p->pPars->fUseMux7 != 0) {
    Gia_ManCleanMark0(p->pGia);
  }
  pGVar7 = p->pGia;
  if ((Tim_Man_t *)pGVar7->pManTime == (Tim_Man_t *)0x0) {
    for (iVar11 = 0; iVar11 < pGVar7->vCos->nSize; iVar11 = iVar11 + 1) {
      pGVar5 = Gia_ManCo(pGVar7,iVar11);
      iVar3 = Gia_ObjFaninId0p(pGVar7,pGVar5);
      uVar10 = uVar2;
      if (p->pPars->fDoAverage != 0) {
        iVar4 = Lf_ObjCoArrival(p,iVar11);
        uVar10 = (uint)((((double)p->pPars->nRelaxRatio + 100.0) * (double)iVar4) / 100.0);
      }
      Lf_ObjSetRequired(p,iVar3,uVar10);
      pGVar7 = p->pGia;
    }
    iVar11 = pGVar7->nObjs;
    while ((iVar3 = iVar11 + -1, 1 < iVar11 &&
           (pGVar5 = Gia_ManObj(p->pGia,iVar3), pGVar5 != (Gia_Obj_t *)0x0))) {
      uVar10 = (uint)*(undefined8 *)pGVar5;
      iVar11 = iVar3;
      if (-1 < (int)uVar10 && (~uVar10 & 0x1fffffff) != 0) {
        iVar4 = Gia_ObjIsBuf(pGVar5);
        if (iVar4 == 0) {
          iVar4 = Lf_ObjMapRefNum(p,iVar3);
          if (iVar4 != 0) {
            Lf_ManCountMapRefsOne(p,iVar3);
          }
        }
        else {
          iVar4 = Vec_IntEntry(p_00,iVar3);
          Lf_ObjSetRequired(p,iVar3 - (uVar10 & 0x1fffffff),iVar4);
        }
      }
    }
  }
  else {
    Tim_ManIncrementTravId((Tim_Man_t *)pGVar7->pManTime);
    if (p->pPars->fDoAverage == 0) {
      Tim_ManInitPoRequiredAll((Tim_Man_t *)p->pGia->pManTime,(float)(int)uVar2);
      pGVar7 = p->pGia;
    }
    else {
      for (iVar11 = 0; pGVar7 = p->pGia, iVar11 < pGVar7->vCos->nSize; iVar11 = iVar11 + 1) {
        pTVar1 = (Tim_Man_t *)pGVar7->pManTime;
        iVar3 = Lf_ObjCoArrival(p,iVar11);
        Tim_ManSetCoRequired
                  (pTVar1,iVar11,
                   (float)(int)((((double)p->pPars->nRelaxRatio + 100.0) * (double)iVar3) / 100.0));
      }
    }
    iVar11 = pGVar7->nObjs;
    while ((iVar3 = iVar11 + -1, 1 < iVar11 &&
           (pGVar5 = Gia_ManObj(p->pGia,iVar3), pGVar5 != (Gia_Obj_t *)0x0))) {
      iVar4 = Gia_ObjIsBuf(pGVar5);
      uVar10 = (uint)*(ulong *)pGVar5;
      iVar11 = iVar3;
      if (iVar4 == 0) {
        uVar8 = *(ulong *)pGVar5 & 0x1fffffff;
        if (uVar8 == 0x1fffffff || (int)uVar10 < 0) {
          if ((~uVar10 & 0x9fffffff) == 0) {
            pTVar1 = (Tim_Man_t *)p->pGia->pManTime;
            iVar4 = Gia_ObjCioId(pGVar5);
            iVar3 = Vec_IntEntry(p_00,iVar3);
            Tim_ManSetCiRequired(pTVar1,iVar4,(float)iVar3);
          }
          else {
            if ((-1 < (int)uVar10) || ((int)uVar8 == 0x1fffffff)) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                            ,0x668,"void Lf_ManCountMapRefs(Lf_Man_t *)");
            }
            pTVar1 = (Tim_Man_t *)p->pGia->pManTime;
            iVar4 = Gia_ObjCioId(pGVar5);
            fVar12 = Tim_ManGetCoRequired(pTVar1,iVar4);
            Lf_ObjSetRequired(p,iVar3 - (*(uint *)pGVar5 & 0x1fffffff),(int)fVar12);
          }
        }
        else {
          iVar4 = Lf_ObjMapRefNum(p,iVar3);
          if (iVar4 != 0) {
            Lf_ManCountMapRefsOne(p,iVar3);
          }
        }
      }
      else {
        iVar4 = Vec_IntEntry(p_00,iVar3);
        Lf_ObjSetRequired(p,iVar3 - (uVar10 & 0x1fffffff),iVar4);
      }
    }
  }
  if (p->pPars->fUseMux7 == 0) {
    return;
  }
  Gia_ManCleanMark0(p->pGia);
  return;
}

Assistant:

void Lf_ManCountMapRefs( Lf_Man_t * p )
{
    // compute delay
    Gia_Obj_t * pObj;
    int i, Id, Delay = 0;
    for ( i = 0; i < Gia_ManCoNum(p->pGia); i++ )
        Delay = Abc_MaxInt( Delay, Lf_ObjCoArrival2(p, i) );
    // check delay target
    if ( p->pPars->DelayTarget == -1 && p->pPars->nRelaxRatio )
        p->pPars->DelayTarget = (int)((float)Delay * (100.0 + p->pPars->nRelaxRatio) / 100.0);
    if ( p->pPars->DelayTarget != -1 )
    {
        if ( Delay < p->pPars->DelayTarget + 0.01 )
            Delay = p->pPars->DelayTarget;
        else if ( p->pPars->nRelaxRatio == 0 )
            Abc_Print( 0, "Relaxing user-specified delay target from %d to %d.\n", p->pPars->DelayTarget, Delay );
    }
    p->pPars->Delay = Delay;
    // compute area/edges/required
    p->pPars->Mux7 = p->pPars->Area = p->pPars->Edge = p->Switches = 0;
    Vec_IntFill( &p->vRequired, Gia_ManObjNum(p->pGia), ABC_INFINITY );
    if ( p->pPars->fUseMux7 )
        Gia_ManCleanMark0(p->pGia);
    if ( p->pGia->pManTime != NULL )
    {
        Tim_ManIncrementTravId( (Tim_Man_t*)p->pGia->pManTime );
        if ( p->pPars->fDoAverage )
            for ( i = 0; i < Gia_ManCoNum(p->pGia); i++ )
               Tim_ManSetCoRequired( (Tim_Man_t*)p->pGia->pManTime, i, (int)(Lf_ObjCoArrival(p, i) * (100.0 + p->pPars->nRelaxRatio) / 100.0) );
        else  
            Tim_ManInitPoRequiredAll( (Tim_Man_t*)p->pGia->pManTime, Delay );
        Gia_ManForEachObjReverse1( p->pGia, pObj, i )
        {
            if ( Gia_ObjIsBuf(pObj) )
                Lf_ObjSetRequired( p, Gia_ObjFaninId0(pObj, i), Lf_ObjRequired(p, i) );
            else if ( Gia_ObjIsAnd(pObj) )
            {
                if ( Lf_ObjMapRefNum(p, i) )
                    Lf_ManCountMapRefsOne( p, i );
            }
            else if ( Gia_ObjIsCi(pObj) )
                Tim_ManSetCiRequired( (Tim_Man_t*)p->pGia->pManTime, Gia_ObjCioId(pObj), Lf_ObjRequired(p, i) );
            else if ( Gia_ObjIsCo(pObj) )
            {
                int reqTime = Tim_ManGetCoRequired( (Tim_Man_t*)p->pGia->pManTime, Gia_ObjCioId(pObj) );
                Lf_ObjSetRequired( p, Gia_ObjFaninId0(pObj, i), reqTime );
            }
            else assert( 0 );
        }
    }
    else
    {
        Gia_ManForEachCoDriverId( p->pGia, Id, i )
            Lf_ObjSetRequired( p, Id, p->pPars->fDoAverage ? (int)(Lf_ObjCoArrival(p, i) * (100.0 + p->pPars->nRelaxRatio) / 100.0) : Delay );
        Gia_ManForEachAndReverse( p->pGia, pObj, i )
            if ( Gia_ObjIsBuf(pObj) )
                Lf_ObjSetRequired( p, Gia_ObjFaninId0(pObj, i), Lf_ObjRequired(p, i) );
            else if ( Lf_ObjMapRefNum(p, i) )
                Lf_ManCountMapRefsOne( p, i );
    }
    if ( p->pPars->fUseMux7 )
        Gia_ManCleanMark0(p->pGia);
}